

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_layout.cc
# Opt level: O0

Ops * __thiscall Typelib::MemoryLayout::simplifyInit(Ops *__return_storage_ptr__,MemoryLayout *this)

{
  bool bVar1;
  InvalidMemoryLayout *this_00;
  pointer *this_01;
  size_type sVar2;
  reference pvVar3;
  Ops *simplified;
  string local_a0 [32];
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_80;
  unsigned_long *local_78;
  const_iterator local_60;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_58;
  const_iterator end;
  MemoryLayout result;
  MemoryLayout *this_local;
  
  result.m_offset = (size_t)this;
  MemoryLayout((MemoryLayout *)&end);
  local_60 = init_begin(this);
  local_78 = (unsigned_long *)init_end(this);
  local_58._M_current =
       (unsigned_long *)
       simplifyInit(this,local_60,(const_iterator)local_78,(MemoryLayout *)&end,true);
  local_80._M_current = (unsigned_long *)init_end(this);
  bVar1 = __gnu_cxx::operator!=(&local_58,&local_80);
  if (!bVar1) {
    this_01 = &result.ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01);
    if (sVar2 == 2) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01,0);
      if (*pvVar3 == 3) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01);
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (__return_storage_ptr__,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01);
    ~MemoryLayout((MemoryLayout *)&end);
    return __return_storage_ptr__;
  }
  simplified._6_1_ = 1;
  this_00 = (InvalidMemoryLayout *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a0,"simplifyInit() did not reach the end",(allocator *)((long)&simplified + 7));
  InvalidMemoryLayout::InvalidMemoryLayout(this_00,(string *)local_a0);
  simplified._6_1_ = 0;
  __cxa_throw(this_00,&InvalidMemoryLayout::typeinfo,InvalidMemoryLayout::~InvalidMemoryLayout);
}

Assistant:

MemoryLayout::Ops MemoryLayout::simplifyInit() const
{
    MemoryLayout result;
    const_iterator end = simplifyInit(init_begin(), init_end(), result, true);
    if (end != init_end())
        throw InvalidMemoryLayout("simplifyInit() did not reach the end");

    MemoryLayout::Ops& simplified = result.init_ops;
    if (simplified.size() == 2 && simplified[0] == FLAG_INIT_SKIP)
        simplified.clear();
    return simplified;
}